

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  TestGroupStats *this_local;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_002be988;
  GroupInfo::~GroupInfo(&this->groupInfo);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() {}